

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::frame(Console *this)

{
  int frame;
  int iVar1;
  
  do {
    iVar1 = step(this);
  } while (this->prev_frame == iVar1);
  this->prev_frame = iVar1;
  APU::step(this->apu);
  APU::stepFrame(this->apu);
  return;
}

Assistant:

void Console::frame() {
    int frame = 0;

    do {
        frame = step();
    } while (prev_frame == frame);

    prev_frame = frame;

    getAPU()->step();
    getAPU()->stepFrame();
}